

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.h
# Opt level: O0

string * __thiscall FormToken::toString_abi_cxx11_(FormToken *this)

{
  runtime_error *this_00;
  undefined4 *in_RSI;
  char cVar1;
  string *in_RDI;
  string *s;
  
  std::__cxx11::string::string(in_RDI);
  cVar1 = (char)in_RDI;
  switch(*in_RSI) {
  case 0:
    std::__cxx11::string::push_back(cVar1);
    break;
  case 1:
    std::__cxx11::string::append(in_RDI);
    break;
  case 2:
    std::__cxx11::string::push_back(cVar1);
    break;
  case 3:
    std::__cxx11::string::push_back(cVar1);
    break;
  case 4:
    std::__cxx11::string::push_back(cVar1);
    break;
  case 5:
    std::__cxx11::string::append((char *)in_RDI);
    break;
  case 6:
    std::__cxx11::string::append(in_RDI);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"toString unknown token kind");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RDI;
}

Assistant:

std::string toString() {
    std::string s;
    switch (kind) {
      case TokenKind::WHITESPACE:
        s.push_back(' ');
        break;
      case TokenKind::SYMBOL:
        s.append(*str);
        break;
      case TokenKind::OPEN_PAREN:
        s.push_back('(');
        break;
      case TokenKind::DOT:
        s.push_back('.');
        break;
      case TokenKind::CLOSE_PAREN:
        s.push_back(')');
        break;
      case TokenKind::EMPTY_PAIR:
        s.append("()");
        break;
      case TokenKind::SPECIAL_SYMBOL:
        s.append(*str);
        break;
      default:
        throw std::runtime_error("toString unknown token kind");
    }
    return s;
  }